

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,bool reuse_addr,type_conflict param_5)

{
  service_type *psVar1;
  implementation_type *piVar2;
  byte in_CL;
  sockaddr *in_RDX;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RDI;
  protocol_type protocol;
  error_code ec;
  basic_endpoint<asio::ip::tcp> *in_stack_fffffffffffffee8;
  error_code *in_stack_fffffffffffffef0;
  reactive_socket_service_base *this_00;
  error_code *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  boolean<1,_2> local_5c;
  int local_58;
  int local_44;
  undefined1 local_40 [39];
  byte local_19;
  sockaddr *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             (io_context *)in_stack_ffffffffffffff10);
  std::error_code::error_code(in_stack_fffffffffffffef0);
  local_44 = (int)ip::basic_endpoint<asio::ip::tcp>::protocol(in_stack_fffffffffffffee8);
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(in_RDI);
  local_58 = detail::reactive_socket_service<asio::ip::tcp>::open
                       (psVar1,(char *)piVar2,(int)&local_44,local_40);
  detail::throw_error(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  if ((local_19 & 1) != 0) {
    detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    get_service(in_RDI);
    detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    get_implementation(in_RDI);
    detail::socket_option::boolean<1,_2>::boolean(&local_5c,true);
    detail::reactive_socket_service<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((reactive_socket_service<asio::ip::tcp> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (implementation_type *)in_stack_ffffffffffffff20,
               (boolean<1,_2> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
    detail::throw_error(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  }
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(in_RDI);
  detail::reactive_socket_service<asio::ip::tcp>::bind
            (psVar1,(int)piVar2,local_18,(socklen_t)local_40);
  detail::throw_error(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  this_00 = &psVar1->super_reactive_socket_service_base;
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(in_RDI);
  detail::reactive_socket_service_base::listen(this_00,(int)piVar2,0x1000);
  detail::throw_error((error_code *)this_00,(char *)in_stack_fffffffffffffee8);
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const endpoint_type& endpoint, bool reuse_addr = true,
      typename constraint<
        is_convertible<ExecutionContext&, execution_context&>::value
      >::type = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    if (reuse_addr)
    {
      impl_.get_service().set_option(impl_.get_implementation(),
          socket_base::reuse_address(true), ec);
      asio::detail::throw_error(ec, "set_option");
    }
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
    impl_.get_service().listen(impl_.get_implementation(),
        socket_base::max_listen_connections, ec);
    asio::detail::throw_error(ec, "listen");
  }